

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_int_2_suite::test_one(void)

{
  undefined4 local_50;
  value_type_conflict1 local_4c [2];
  undefined4 local_44;
  size_type local_40;
  undefined1 local_36;
  undefined1 local_35 [2];
  undefined1 local_33;
  undefined1 local_32 [2];
  undefined1 local_30 [8];
  moment<int,_2> filter;
  
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push
            ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30,1);
  local_32[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::empty
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_33 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x198,"void mean_int_2_suite::test_one()",local_32,&local_33);
  local_35[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::full
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_36 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x199,"void mean_int_2_suite::test_one()",local_35,&local_36);
  local_40 = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_44 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x19a,"void mean_int_2_suite::test_one()",&local_40,&local_44);
  local_4c[0] = trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<int,_2UL,_(trial::online::with)1> *)local_30);
  local_50 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x19b,"void mean_int_2_suite::test_one()",local_4c,&local_50);
  return;
}

Assistant:

void test_one()
{
    window::moment<int, 2> filter;
    filter.push(1);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1);
}